

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameCollaborativeGraphical.cpp
# Opt level: O1

string * __thiscall
BayesianGameCollaborativeGraphical::SoftPrintSummary_abi_cxx11_
          (string *__return_storage_ptr__,BayesianGameCollaborativeGraphical *this)

{
  pointer pSVar1;
  char cVar2;
  string *psVar3;
  ostream *poVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  stringstream ss;
  string local_1e0;
  string *local_1c0;
  stringstream local_1b8 [16];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  local_1c0 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1b8);
  BayesianGameBase::SoftPrintSummary_abi_cxx11_(&local_1e0,(BayesianGameBase *)this);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  if (this->_m_nrLRFs != 0) {
    uVar6 = 1;
    uVar7 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"LRF function ",0xd);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,":",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Agent scope ",0xc);
      pSVar1 = (this->_m_agentScopes).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar5 = ((long)(this->_m_agentScopes).super__Vector_base<Scope,_std::allocator<Scope>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)pSVar1 >> 3) *
              -0x5555555555555555;
      if (uVar5 < uVar7 || uVar5 - uVar7 == 0) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar7
                  );
      }
      PrintTools::SoftPrintVector<Scope>(&local_1e0,pSVar1 + uVar7);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,local_1e0._M_dataplus._M_p,local_1e0._M_string_length
                         );
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
        operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
      }
      cVar2 = (char)(ostream *)local_1a8;
      std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar2);
      std::ostream::put(cVar2);
      std::ostream::flush();
      uVar7 = (ulong)uVar6;
      uVar6 = uVar6 + 1;
    } while (uVar7 < this->_m_nrLRFs);
  }
  psVar3 = local_1c0;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return psVar3;
}

Assistant:

string BayesianGameCollaborativeGraphical::SoftPrintSummary() const
{
    stringstream ss;
    ss << BayesianGameBase::SoftPrintSummary();    
    for(Index e=0; e < _m_nrLRFs; e++)
    {
        ss << "LRF function " << e << ":" << endl;
        ss << "Agent scope " << SoftPrintVector(_m_agentScopes.at(e)) << endl;
        //ss << _m_LRFs.at(e)->SoftPrint();
        ss << endl;
    }
    return(ss.str());
}